

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void wr_player_spells(void)

{
  wchar_t wVar1;
  long lVar2;
  
  wr_u16b((uint16_t)(player->class->magic).total_spells);
  if (L'\0' < (player->class->magic).total_spells) {
    lVar2 = 0;
    do {
      wr_byte(player->spell_flags[lVar2]);
      lVar2 = lVar2 + 1;
      wVar1 = (player->class->magic).total_spells;
    } while (lVar2 < wVar1);
    if (L'\0' < wVar1) {
      lVar2 = 0;
      do {
        wr_byte(player->spell_order[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (player->class->magic).total_spells);
    }
  }
  return;
}

Assistant:

void wr_player_spells(void)
{
	int i;

	wr_u16b(player->class->magic.total_spells);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_flags[i]);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_order[i]);
}